

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodeltester.cpp
# Opt level: O0

void __thiscall
QAbstractItemModelTesterPrivate::columnsAboutToBeRemoved
          (QAbstractItemModelTesterPrivate *this,QModelIndex *parent,int first,int last)

{
  bool bVar1;
  QDebug *pQVar2;
  QAbstractItemModel *pQVar3;
  QVariant *variant;
  QDebug *o;
  undefined4 in_ECX;
  int in_EDX;
  char *in_RSI;
  ChangeInFlight *in_RDI;
  long in_FS_OFFSET;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  undefined4 uVar4;
  int in_stack_fffffffffffffe4c;
  undefined4 in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe54;
  QString *in_stack_fffffffffffffe58;
  QAbstractItemModel *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  QDebug *in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffee8;
  ChangeInFlight *in_stack_ffffffffffffff08;
  QAbstractItemModelTesterPrivate *in_stack_ffffffffffffff10;
  undefined1 local_e0 [80];
  QDebug local_90;
  QDebug local_88;
  int in_stack_ffffffffffffff80;
  QDebug local_78;
  QDebug local_70;
  QDebug local_68;
  undefined4 local_5c;
  undefined1 *local_58;
  undefined1 *local_50;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_5c = 0;
  uVar4 = 0x313;
  bVar1 = compare<QAbstractItemModelTesterPrivate::ChangeInFlight,QAbstractItemModelTesterPrivate::ChangeInFlight>
                    (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_RDI,in_RSI,
                     (char *)CONCAT44(in_EDX,in_ECX),in_stack_fffffffffffffee8,
                     in_stack_ffffffffffffff80);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    in_RDI[0x31] = ColumnsRemoved;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    lcModelTest();
    anon_unknown.dwarf_21e2d9::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
               CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
               (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffe4c,uVar4));
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_58), bVar1) {
      anon_unknown.dwarf_21e2d9::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x18eaa7);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58,
                 in_stack_fffffffffffffe54,(char *)CONCAT44(in_stack_fffffffffffffe4c,uVar4),
                 (char *)0x18eac3);
      QMessageLogger::debug();
      QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                         (char *)in_stack_fffffffffffffea8);
      QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                         (char *)in_stack_fffffffffffffea8);
      QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                         in_stack_fffffffffffffe4c);
      in_stack_fffffffffffffea8 =
           QDebug::operator<<((QDebug *)
                              CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                              (char *)in_stack_fffffffffffffea8);
      QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                         in_stack_fffffffffffffe4c);
      pQVar2 = QDebug::operator<<((QDebug *)
                                  CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                                  (char *)in_stack_fffffffffffffea8);
      QDebug::QDebug(&local_88,pQVar2);
      ::operator<<((Stream *)&stack0xffffffffffffff80,(QModelIndex *)&local_88);
      QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                         (char *)in_stack_fffffffffffffea8);
      pQVar3 = QPointer<QAbstractItemModel>::operator->((QPointer<QAbstractItemModel> *)0x18ebd5);
      (**(code **)(*(long *)pQVar3 + 0x90))(&local_28,pQVar3,in_RSI,0);
      QVariant::toString();
      pQVar2 = QDebug::operator<<((QDebug *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      variant = (QVariant *)
                QDebug::operator<<((QDebug *)
                                   CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                                   (char *)in_stack_fffffffffffffea8);
      pQVar3 = QPointer<QAbstractItemModel>::operator->((QPointer<QAbstractItemModel> *)0x18ec51);
      in_stack_fffffffffffffe7c = (**(code **)(*(long *)pQVar3 + 0x78))(pQVar3,in_RSI);
      QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                         in_stack_fffffffffffffe4c);
      o = QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78)
                             ,(char *)in_stack_fffffffffffffea8);
      QDebug::QDebug(&local_78,o);
      pQVar3 = QPointer<QAbstractItemModel>::operator->((QPointer<QAbstractItemModel> *)0x18ecbd);
      (**(code **)(*(long *)pQVar3 + 0x60))(local_e0,pQVar3,in_EDX + -1,0,in_RSI);
      ::operator<<((Stream *)&local_70,(QModelIndex *)&local_78);
      in_stack_fffffffffffffe58 = (QString *)(in_RDI + 0x1e);
      in_stack_fffffffffffffe60 =
           QPointer<QAbstractItemModel>::operator->((QPointer<QAbstractItemModel> *)0x18ed1b);
      pQVar3 = QPointer<QAbstractItemModel>::operator->((QPointer<QAbstractItemModel> *)0x18ed2a);
      (**(code **)(*(long *)pQVar3 + 0x60))(&stack0xffffffffffffff08,pQVar3,in_EDX + -1,0,in_RSI);
      (**(code **)(*(long *)in_stack_fffffffffffffe60 + 0x90))
                (&local_48,in_stack_fffffffffffffe60,&stack0xffffffffffffff08,0);
      ::operator<<(pQVar2,variant);
      QDebug::~QDebug(&local_68);
      QVariant::~QVariant(&local_48);
      QDebug::~QDebug(&local_70);
      QDebug::~QDebug(&local_78);
      QString::~QString((QString *)0x18edd8);
      QVariant::~QVariant(&local_28);
      QDebug::~QDebug((QDebug *)&stack0xffffffffffffff80);
      QDebug::~QDebug(&local_88);
      QDebug::~QDebug(&local_90);
      local_50 = (undefined1 *)((ulong)local_50 & 0xffffffffffffff00);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemModelTesterPrivate::columnsAboutToBeRemoved(const QModelIndex &parent, int first,
                                                              int last)
{
    MODELTESTER_COMPARE(changeInFlight, ChangeInFlight::None);
    changeInFlight = ChangeInFlight::ColumnsRemoved;

    qCDebug(lcModelTest) << "columnsAboutToBeRemoved"
                         << "start=" << first << "end=" << last << "parent=" << parent
                         << "parent data=" << model->data(parent).toString()
                         << "current count of parent=" << model->rowCount(parent)
                         << "last before removal=" << model->index(first - 1, 0, parent)
                         << model->data(model->index(first - 1, 0, parent));
}